

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeContainerFormatParser.cpp
# Opt level: O3

void __thiscall xe::ContainerFormatParser::ContainerFormatParser(ContainerFormatParser *this)

{
  uchar *puVar1;
  
  this->m_element = CONTAINERELEMENT_INCOMPLETE;
  this->m_elementLen = 0;
  this->m_state = STATE_AT_LINE_START;
  (this->m_attribute)._M_dataplus._M_p = (pointer)&(this->m_attribute).field_2;
  (this->m_attribute)._M_string_length = 0;
  (this->m_attribute).field_2._M_local_buf[0] = '\0';
  (this->m_value)._M_dataplus._M_p = (pointer)&(this->m_value).field_2;
  (this->m_value)._M_string_length = 0;
  (this->m_value).field_2._M_local_buf[0] = '\0';
  (this->m_buf).m_numElements = 0;
  (this->m_buf).m_front = 0;
  (this->m_buf).m_back = 0;
  (this->m_buf).m_size = 0x400;
  puVar1 = (uchar *)operator_new__(0x400);
  (this->m_buf).m_buffer = puVar1;
  return;
}

Assistant:

ContainerFormatParser::ContainerFormatParser (void)
	: m_element		(CONTAINERELEMENT_INCOMPLETE)
	, m_elementLen	(0)
	, m_state		(STATE_AT_LINE_START)
	, m_buf			(CONTAINERFORMATPARSER_INITIAL_BUFFER_SIZE)
{
}